

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O3

void __thiscall
sliding_puzzle::SlidingPuzzle::SlidingPuzzle(SlidingPuzzle *this,int size,int anchor)

{
  pointer *ppaVar1;
  undefined4 *puVar2;
  double dVar3;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  pointer paVar6;
  undefined4 uVar7;
  double dVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  time_t tVar12;
  long lVar13;
  int *__src;
  long lVar14;
  int i;
  int iVar15;
  long lVar16;
  long lVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  vector<int,_std::allocator<int>_> start_tiles;
  int local_5c;
  array<double,_3UL> local_58;
  double local_38;
  
  (this->explored_)._M_h._M_buckets = &(this->explored_)._M_h._M_single_bucket;
  (this->explored_)._M_h._M_bucket_count = 1;
  (this->explored_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->explored_)._M_h._M_element_count = 0;
  (this->explored_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->explored_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->explored_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (SlidingPuzzle(int,int)::seed_once == '\0') {
    SlidingPuzzle(int,int)::seed_once = '\x01';
    tVar12 = time((time_t *)0x0);
    srand((uint)tVar12);
  }
  hash_time = 0;
  puzzle_size = size;
  puzzle_anchor = anchor;
  this->num_inadmissible_heuristic_ = 4;
  this->heuristic_weight_range_[0] = 1.0;
  this->heuristic_weight_range_[1] = 5.0;
  iVar15 = 0;
  do {
    uVar18 = SUB84(this->heuristic_weight_range_[0],0);
    uVar19 = (undefined4)((ulong)this->heuristic_weight_range_[0] >> 0x20);
    lVar16 = 0;
    do {
      local_38 = (double)CONCAT44(uVar19,uVar18);
      iVar11 = rand();
      dVar3 = this->heuristic_weight_range_[0];
      uVar18 = SUB84(dVar3,0);
      uVar19 = (undefined4)((ulong)dVar3 >> 0x20);
      local_58._M_elems[lVar16] =
           (double)iVar11 / (2147483647.0 / (this->heuristic_weight_range_[1] - dVar3)) + local_38;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    __position._M_current =
         (this->heuristic_weight_).
         super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->heuristic_weight_).
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
      _M_realloc_insert<std::array<double,3ul>const&>
                ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)
                 &this->heuristic_weight_,__position,&local_58);
    }
    else {
      (__position._M_current)->_M_elems[2] = local_58._M_elems[2];
      (__position._M_current)->_M_elems[0] = local_58._M_elems[0];
      (__position._M_current)->_M_elems[1] = local_58._M_elems[1];
      ppaVar1 = &(this->heuristic_weight_).
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    iVar15 = iVar15 + 1;
  } while (iVar15 < this->num_inadmissible_heuristic_);
  local_58._M_elems[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58._M_elems + 1),
             (SlidingPuzzleState **)&local_58,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_5c);
  dVar8 = local_58._M_elems[1];
  dVar3 = local_58._M_elems[0];
  local_58._M_elems[0] = 0.0;
  local_58._M_elems[1] = 0.0;
  p_Var4 = (this->start_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)dVar3;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar8;
  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1] !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1]);
  }
  local_58._M_elems[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58._M_elems + 1),
             (SlidingPuzzleState **)&local_58,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_5c);
  uVar18 = local_58._M_elems[0]._0_4_;
  uVar19 = local_58._M_elems[0]._4_4_;
  uVar7 = local_58._M_elems[1]._0_4_;
  uVar9 = local_58._M_elems[1]._4_4_;
  local_58._M_elems[0] = 0.0;
  local_58._M_elems[1] = 0.0;
  p_Var4 = (this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  *(undefined4 *)
   &(this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = uVar18;
  *(undefined4 *)
   ((long)&(this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 4) = uVar19;
  *(undefined4 *)
   &(this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = uVar7;
  *(undefined4 *)
   ((long)&(this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar9;
  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1] !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_elems[1]);
  }
  iVar15 = puzzle_size;
  if (0 < puzzle_size) {
    peVar5 = (this->goal_).
             super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar11 = 1;
    lVar16 = 0;
    do {
      if (iVar15 < 1) {
        lVar13 = (long)iVar15;
      }
      else {
        lVar17 = *(long *)((long)(peVar5->state_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar16 * 0x18);
        lVar14 = 0;
        do {
          *(int *)(lVar17 + lVar14 * 4) =
               (iVar11 + (int)lVar14) % (int)((double)iVar15 * (double)iVar15);
          lVar14 = lVar14 + 1;
          lVar13 = (long)puzzle_size;
          iVar15 = puzzle_size;
        } while (lVar14 < lVar13);
        iVar11 = iVar11 + (int)lVar14;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < lVar13);
  }
  local_58._M_elems[0] = 0.0;
  local_58._M_elems[1] = 0.0;
  local_58._M_elems[2] = 0.0;
  local_5c = 0;
  if (iVar15 != 0) {
    do {
      if (local_58._M_elems[1] == local_58._M_elems[2]) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_58,(iterator)local_58._M_elems[1],
                   &local_5c);
      }
      else {
        *(int *)local_58._M_elems[1] = local_5c;
        local_58._M_elems[1] = (double)((long)local_58._M_elems[1] + 4);
      }
      local_5c = local_5c + 1;
    } while (local_5c < puzzle_size * puzzle_size);
    if (0 < puzzle_size) {
      lVar16 = 0;
      iVar15 = puzzle_size;
      do {
        if (iVar15 < 1) {
          lVar13 = (long)iVar15;
        }
        else {
          lVar17 = 0;
          do {
            iVar15 = rand();
            lVar13 = (long)(int)((ulong)(long)iVar15 %
                                (ulong)((long)local_58._M_elems[1] - (long)local_58._M_elems[0] >> 2
                                       ));
            puVar2 = (undefined4 *)((long)local_58._M_elems[0] + lVar13 * 4);
            __src = puVar2 + 1;
            *(undefined4 *)
             (*(long *)((long)(((this->start_).
                                super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->state_).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar16 * 0x18) +
             lVar17 * 4) = *puVar2;
            if (__src != (int *)local_58._M_elems[1]) {
              memmove((void *)((long)local_58._M_elems[0] + lVar13 * 4),__src,
                      (long)local_58._M_elems[1] - (long)__src);
            }
            local_58._M_elems[1] = (double)((long)local_58._M_elems[1] + -4);
            lVar17 = lVar17 + 1;
            lVar13 = (long)puzzle_size;
            iVar15 = puzzle_size;
          } while (lVar17 < lVar13);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < lVar13);
    }
  }
  bVar10 = generateSolvableStartState(this,0x2ee);
  if ((void *)local_58._M_elems[0] != (void *)0x0) {
    operator_delete((void *)local_58._M_elems[0],
                    (long)local_58._M_elems[2] - (long)local_58._M_elems[0]);
  }
  paVar6 = (this->heuristic_weight_).
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar6 != (pointer)0x0) {
    operator_delete(paVar6,(long)(this->heuristic_weight_).
                                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar6);
  }
  p_Var4 = (this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->start_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  std::
  _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  _Unwind_Resume(bVar10);
}

Assistant:

SlidingPuzzle::SlidingPuzzle(int size, int anchor)
{
  static bool seed_once = true;
  if (seed_once)
  {
    seed_once = false;
    srand(time(NULL));
  }
  
  puzzle_size = size;
  puzzle_anchor = anchor;
  
  hash_time = 0;
  
  // Multi heuristic params
  num_inadmissible_heuristic_ = 4;
  heuristic_weight_range_[0] = 1.0;
  heuristic_weight_range_[1] = 5.0;
  for (int i=0; i<num_inadmissible_heuristic_; ++i)
  {
    std::array<double,3> weight;
    for (int j=0; j<3; ++j)
    {
      weight[j] = heuristic_weight_range_[0] +
        static_cast<double>(rand())/
          (RAND_MAX/(heuristic_weight_range_[1]-heuristic_weight_range_[0]));
    }
    heuristic_weight_.push_back(weight);
  }
  
  start_ = std::make_shared<SlidingPuzzleState>();
  goal_ = std::make_shared<SlidingPuzzleState>();
  int value = 1;
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      goal_->state_[i][j] = value % static_cast<int>(pow(puzzle_size,2));
      ++value;
    }
  }

  // Random start state
  std::vector<int> start_tiles;
  for (int i=0; i<puzzle_size*puzzle_size; ++i)
  {
    start_tiles.push_back(i);
  }
  
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      int index = rand() % start_tiles.size();
      start_->state_[i][j] = start_tiles[index];
      start_tiles.erase(start_tiles.begin()+index);
    }
  }

  generateSolvableStartState(750);

  std::cout << "The random start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}